

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall
VulkanHppGenerator::appendRAIIDispatcherCommands
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedCommands,string *title,string *contextInitializers,string *contextMembers,
          string *deviceAssignments,string *deviceMembers,string *instanceAssignments,
          string *instanceMembers)

{
  bool bVar1;
  __type_conflict _Var2;
  reference pRVar3;
  reference __x;
  pointer ppVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  bool local_94a;
  bool local_922;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  byte local_57b;
  byte local_57a;
  allocator<char> local_579;
  string local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  byte local_313;
  byte local_312;
  allocator<char> local_311;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
  local_1b0;
  const_iterator commandIt;
  NameLine *command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *__range2;
  RequireData *require;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *__range1;
  string imp;
  string im;
  string ia;
  string dmp;
  string dm;
  string da;
  string cm;
  string ci;
  string *contextMembers_local;
  string *contextInitializers_local;
  string *title_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *listedCommands_local;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *requireData_local;
  VulkanHppGenerator *this_local;
  
  std::__cxx11::string::string((string *)(cm.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(da.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(dm.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(dmp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(ia.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(im.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(imp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           ::begin(requireData);
  require = (RequireData *)
            std::
            vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            ::end(requireData);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                                *)&require);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string((string *)&local_800);
      addTitleAndProtection(&local_7e0,this,title,(string *)((long)&cm.field_2 + 8),&local_800);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (contextInitializers,&local_7e0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::string((string *)&local_840);
      addTitleAndProtection(&local_820,this,title,(string *)((long)&da.field_2 + 8),&local_840);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (contextMembers,&local_820);
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::string((string *)&local_880);
      addTitleAndProtection(&local_860,this,title,(string *)((long)&dm.field_2 + 8),&local_880);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (deviceAssignments,&local_860);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_880);
      addTitleAndProtection
                (&local_8a0,this,title,(string *)((long)&dmp.field_2 + 8),
                 (string *)((long)&ia.field_2 + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (deviceMembers,&local_8a0);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::string((string *)&local_8e0);
      addTitleAndProtection(&local_8c0,this,title,(string *)((long)&im.field_2 + 8),&local_8e0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (instanceAssignments,&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_8e0);
      addTitleAndProtection
                (&local_900,this,title,(string *)((long)&imp.field_2 + 8),(string *)&__range1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (instanceMembers,&local_900);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)(imp.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(im.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(ia.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(dmp.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(dm.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(da.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(cm.field_2._M_local_buf + 8));
      return;
    }
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
             ::operator*(&__end1);
    __end2 = std::
             vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
             begin(&pRVar3->commands);
    command = (NameLine *)
              std::
              vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
              end(&pRVar3->commands);
    while (bVar1 = __gnu_cxx::
                   operator==<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                             (&__end2,(__normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                                       *)&command), ((bVar1 ^ 0xffU) & 1) != 0) {
      __x = __gnu_cxx::
            __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
            ::operator*(&__end2);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(listedCommands,&__x->name);
      commandIt._M_node = (_Base_ptr)pVar5.first._M_node;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_1b0._M_node =
             (_Base_ptr)
             anon_unknown.dwarf_b1723::findByNameOrAlias<VulkanHppGenerator::CommandData>
                       (&this->m_commands,&__x->name);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                 ::operator->(&local_1b0);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(&(ppVar4->second).handle);
        if (bVar1) {
          std::operator+(&local_270,", ",&__x->name);
          std::operator+(&local_250,&local_270,"( PFN_");
          std::operator+(&local_230,&local_250,&__x->name);
          std::operator+(&local_210,&local_230,"( getProcAddr( NULL, \"");
          std::operator+(&local_1f0,&local_210,&__x->name);
          std::operator+(&local_1d0,&local_1f0,"\" ) ) )");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cm.field_2 + 8),&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::operator+(&local_2f0,"      PFN_",&__x->name);
          std::operator+(&local_2d0,&local_2f0," ");
          std::operator+(&local_2b0,&local_2d0,&__x->name);
          std::operator+(&local_290,&local_2b0," = 0;\n");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&da.field_2 + 8),&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
        }
        else {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                   ::operator->(&local_1b0);
          local_312 = 0;
          local_313 = 0;
          bVar1 = std::operator==(&(ppVar4->second).handle,"VkDevice");
          local_922 = true;
          if (!bVar1) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                     ::operator->(&local_1b0);
            std::allocator<char>::allocator();
            local_312 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_310,"VkDevice",&local_311);
            local_313 = 1;
            local_922 = hasParentHandle(this,&(ppVar4->second).handle,&local_310);
          }
          if ((local_313 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_310);
          }
          if ((local_312 & 1) != 0) {
            std::allocator<char>::~allocator(&local_311);
          }
          if (local_922 == false) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                     ::operator->(&local_1b0);
            local_57a = 0;
            local_57b = 0;
            bVar1 = std::operator==(&(ppVar4->second).handle,"VkInstance");
            local_94a = true;
            if (!bVar1) {
              ppVar4 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                       ::operator->(&local_1b0);
              std::allocator<char>::allocator();
              local_57a = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_578,"VkInstance",&local_579);
              local_57b = 1;
              local_94a = hasParentHandle(this,&(ppVar4->second).handle,&local_578);
            }
            if (local_94a == false) {
              __assert_fail("( commandIt->second.handle == \"VkInstance\" ) || hasParentHandle( commandIt->second.handle, \"VkInstance\" )"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x2f8,
                            "void VulkanHppGenerator::appendRAIIDispatcherCommands(const std::vector<RequireData> &, std::set<std::string> &, const std::string &, std::string &, std::string &, std::string &, std::string &, std::string &, std::string &) const"
                           );
            }
            if ((local_57b & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_578);
            }
            if ((local_57a & 1) != 0) {
              std::allocator<char>::~allocator(&local_579);
            }
            bVar1 = std::operator==(&__x->name,"vkGetInstanceProcAddr");
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              std::operator+(&local_640,"        ",&__x->name);
              std::operator+(&local_620,&local_640," = PFN_");
              std::operator+(&local_600,&local_620,&__x->name);
              std::operator+(&local_5e0,&local_600,"( vkGetInstanceProcAddr( instance, \"");
              std::operator+(&local_5c0,&local_5e0,&__x->name);
              std::operator+(&local_5a0,&local_5c0,"\" ) );\n");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&im.field_2 + 8),&local_5a0);
              std::__cxx11::string::~string((string *)&local_5a0);
              std::__cxx11::string::~string((string *)&local_5c0);
              std::__cxx11::string::~string((string *)&local_5e0);
              std::__cxx11::string::~string((string *)&local_600);
              std::__cxx11::string::~string((string *)&local_620);
              std::__cxx11::string::~string((string *)&local_640);
              ppVar4 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                       ::operator->(&local_1b0);
              _Var2 = std::operator==(&__x->name,&ppVar4->first);
              if (((_Var2 ^ 0xffU) & 1) != 0) {
                ppVar4 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                         ::operator->(&local_1b0);
                std::operator+(&local_700,"        if ( !",&ppVar4->first);
                std::operator+(&local_6e0,&local_700," ) ");
                ppVar4 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                         ::operator->(&local_1b0);
                std::operator+(&local_6c0,&local_6e0,&ppVar4->first);
                std::operator+(&local_6a0,&local_6c0," = ");
                std::operator+(&local_680,&local_6a0,&__x->name);
                std::operator+(&local_660,&local_680,";\n");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&im.field_2 + 8),&local_660);
                std::__cxx11::string::~string((string *)&local_660);
                std::__cxx11::string::~string((string *)&local_680);
                std::__cxx11::string::~string((string *)&local_6a0);
                std::__cxx11::string::~string((string *)&local_6c0);
                std::__cxx11::string::~string((string *)&local_6e0);
                std::__cxx11::string::~string((string *)&local_700);
              }
            }
            std::operator+(&local_780,"      PFN_",&__x->name);
            std::operator+(&local_760,&local_780," ");
            std::operator+(&local_740,&local_760,&__x->name);
            std::operator+(&local_720,&local_740," = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&imp.field_2 + 8),&local_720);
            std::__cxx11::string::~string((string *)&local_720);
            std::__cxx11::string::~string((string *)&local_740);
            std::__cxx11::string::~string((string *)&local_760);
            std::__cxx11::string::~string((string *)&local_780);
            std::operator+(&local_7c0,"      PFN_dummy ",&__x->name);
            std::operator+(&local_7a0,&local_7c0,"_placeholder = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1,&local_7a0);
            std::__cxx11::string::~string((string *)&local_7a0);
            std::__cxx11::string::~string((string *)&local_7c0);
          }
          else {
            std::operator+(&local_3d8,"        ",&__x->name);
            std::operator+(&local_3b8,&local_3d8," = PFN_");
            std::operator+(&local_398,&local_3b8,&__x->name);
            std::operator+(&local_378,&local_398,"( vkGetDeviceProcAddr( device, \"");
            std::operator+(&local_358,&local_378,&__x->name);
            std::operator+(&local_338,&local_358,"\" ) );\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dm.field_2 + 8),&local_338);
            std::__cxx11::string::~string((string *)&local_338);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::__cxx11::string::~string((string *)&local_3d8);
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                     ::operator->(&local_1b0);
            _Var2 = std::operator==(&__x->name,&ppVar4->first);
            if (((_Var2 ^ 0xffU) & 1) != 0) {
              ppVar4 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                       ::operator->(&local_1b0);
              std::operator+(&local_498,"        if ( !",&ppVar4->first);
              std::operator+(&local_478,&local_498," ) ");
              ppVar4 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                       ::operator->(&local_1b0);
              std::operator+(&local_458,&local_478,&ppVar4->first);
              std::operator+(&local_438,&local_458," = ");
              std::operator+(&local_418,&local_438,&__x->name);
              std::operator+(&local_3f8,&local_418,";\n");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&dm.field_2 + 8),&local_3f8);
              std::__cxx11::string::~string((string *)&local_3f8);
              std::__cxx11::string::~string((string *)&local_418);
              std::__cxx11::string::~string((string *)&local_438);
              std::__cxx11::string::~string((string *)&local_458);
              std::__cxx11::string::~string((string *)&local_478);
              std::__cxx11::string::~string((string *)&local_498);
            }
            std::operator+(&local_518,"      PFN_",&__x->name);
            std::operator+(&local_4f8,&local_518," ");
            std::operator+(&local_4d8,&local_4f8,&__x->name);
            std::operator+(&local_4b8,&local_4d8," = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dmp.field_2 + 8),&local_4b8);
            std::__cxx11::string::~string((string *)&local_4b8);
            std::__cxx11::string::~string((string *)&local_4d8);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::__cxx11::string::~string((string *)&local_518);
            std::operator+(&local_558,"      PFN_dummy ",&__x->name);
            std::operator+(&local_538,&local_558,"_placeholder = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&ia.field_2 + 8),&local_538);
            std::__cxx11::string::~string((string *)&local_538);
            std::__cxx11::string::~string((string *)&local_558);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void VulkanHppGenerator::appendRAIIDispatcherCommands( std::vector<RequireData> const & requireData,
                                                       std::set<std::string> &          listedCommands,
                                                       std::string const &              title,
                                                       std::string &                    contextInitializers,
                                                       std::string &                    contextMembers,
                                                       std::string &                    deviceAssignments,
                                                       std::string &                    deviceMembers,
                                                       std::string &                    instanceAssignments,
                                                       std::string &                    instanceMembers ) const
{
  std::string ci, cm, da, dm, dmp, ia, im, imp;
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      if ( listedCommands.insert( command.name ).second )
      {
        auto commandIt = findByNameOrAlias( m_commands, command.name );
        if ( commandIt->second.handle.empty() )
        {
          ci += ", " + command.name + "( PFN_" + command.name + "( getProcAddr( NULL, \"" + command.name + "\" ) ) )";

          cm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
        }
        else if ( ( commandIt->second.handle == "VkDevice" ) || hasParentHandle( commandIt->second.handle, "VkDevice" ) )
        {
          da += "        " + command.name + " = PFN_" + command.name + "( vkGetDeviceProcAddr( device, \"" + command.name + "\" ) );\n";
          // if this is an alias'ed function, use it as a fallback for the original one
          if ( command.name != commandIt->first )
          {
            da += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
          }

          dm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
          dmp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
        else
        {
          assert( ( commandIt->second.handle == "VkInstance" ) || hasParentHandle( commandIt->second.handle, "VkInstance" ) );

          // filter out vkGetInstanceProcAddr, as starting with Vulkan 1.2 it can resolve itself only (!) with an
          // instance nullptr !
          if ( command.name != "vkGetInstanceProcAddr" )
          {
            ia += "        " + command.name + " = PFN_" + command.name + "( vkGetInstanceProcAddr( instance, \"" + command.name + "\" ) );\n";
            // if this is an alias'ed function, use it as a fallback for the original one
            if ( command.name != commandIt->first )
            {
              ia += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
            }
          }

          im += +"      PFN_" + command.name + " " + command.name + " = 0;\n";
          imp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
      }
    }
  }
  contextInitializers += addTitleAndProtection( title, ci );
  contextMembers += addTitleAndProtection( title, cm );
  deviceAssignments += addTitleAndProtection( title, da );
  deviceMembers += addTitleAndProtection( title, dm, dmp );
  instanceAssignments += addTitleAndProtection( title, ia );
  instanceMembers += addTitleAndProtection( title, im, imp );
}